

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS
ref_grid_compact_cell_nodes
          (REF_GRID ref_grid,REF_CELL ref_cell,REF_GLOB *nnode_global,REF_LONG *ncell_global,
          REF_GLOB **l2c)

{
  size_t __size;
  int iVar1;
  int iVar2;
  REF_INT *pRVar3;
  REF_MPI pRVar4;
  bool bVar5;
  REF_STATUS RVar6;
  uint uVar7;
  uint uVar8;
  REF_GLOB *pRVar9;
  void *array;
  int iVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  REF_INT nnode;
  REF_INT part;
  REF_INT nodes [27];
  int local_d4;
  REF_MPI local_d0;
  long *local_c8;
  REF_NODE local_c0;
  int local_b4;
  long *local_b0;
  REF_INT local_a8 [30];
  
  local_d0 = ref_grid->mpi;
  local_c0 = ref_grid->node;
  uVar8 = local_c0->max;
  local_c8 = nnode_global;
  if ((long)(int)uVar8 < 0) {
    bVar5 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x1ed,
           "ref_grid_compact_cell_nodes","malloc *l2c of REF_GLOB negative");
    uVar8 = 1;
  }
  else {
    __size = (long)(int)uVar8 * 8;
    pRVar9 = (REF_GLOB *)malloc(__size);
    *l2c = pRVar9;
    if (pRVar9 == (REF_GLOB *)0x0) {
      bVar5 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x1ed,
             "ref_grid_compact_cell_nodes","malloc *l2c of REF_GLOB NULL");
      uVar8 = 2;
      nnode_global = local_c8;
    }
    else {
      bVar5 = true;
      nnode_global = local_c8;
      if (uVar8 != 0) {
        memset(pRVar9,0xff,__size);
        nnode_global = local_c8;
      }
    }
  }
  if (bVar5) {
    lVar13 = 0;
    *nnode_global = 0;
    *ncell_global = 0;
    local_d4 = 0;
    if (0 < ref_cell->max) {
      iVar14 = 0;
      iVar15 = 0;
      local_b0 = ncell_global;
      do {
        RVar6 = ref_cell_nodes(ref_cell,iVar14,local_a8);
        if (RVar6 == 0) {
          uVar7 = ref_cell_part(ref_cell,local_c0,iVar14,&local_b4);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x1f5,"ref_grid_compact_cell_nodes",(ulong)uVar7,"part",uVar8);
            return uVar7;
          }
          iVar15 = iVar15 + (uint)(local_d0->id == local_b4);
          iVar1 = ref_cell->node_per;
          if (0 < (long)iVar1) {
            pRVar3 = local_c0->part;
            pRVar4 = local_c0->ref_mpi;
            lVar13 = 0;
            iVar10 = local_d4;
            do {
              iVar2 = local_a8[lVar13];
              if ((pRVar4->id == pRVar3[iVar2]) && ((*l2c)[iVar2] == -1)) {
                (*l2c)[iVar2] = (long)iVar10;
                iVar10 = iVar10 + 1;
                local_d4 = iVar10;
              }
              lVar13 = lVar13 + 1;
            } while (iVar1 != lVar13);
          }
        }
        iVar14 = iVar14 + 1;
      } while (iVar14 < ref_cell->max);
      lVar13 = (long)iVar15;
      ncell_global = local_b0;
      nnode_global = local_c8;
    }
    *ncell_global = lVar13;
    uVar8 = ref_mpi_allsum(local_d0,ncell_global,1,2);
    if (uVar8 == 0) {
      if ((long)local_d0->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x204,"ref_grid_compact_cell_nodes","malloc counts of REF_INT negative");
        uVar8 = 1;
      }
      else {
        array = malloc((long)local_d0->n << 2);
        if (array == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x204,"ref_grid_compact_cell_nodes","malloc counts of REF_INT NULL");
          uVar8 = 2;
        }
        else {
          uVar8 = ref_mpi_allgather(local_d0,&local_d4,array,1);
          if (uVar8 == 0) {
            if ((long)local_d0->id < 1) {
              lVar13 = 0;
            }
            else {
              lVar11 = 0;
              lVar13 = 0;
              do {
                lVar13 = lVar13 + *(int *)((long)array + lVar11 * 4);
                lVar11 = lVar11 + 1;
              } while (local_d0->id != lVar11);
            }
            if (0 < (long)local_d0->n) {
              lVar11 = *nnode_global;
              lVar12 = 0;
              do {
                lVar11 = lVar11 + *(int *)((long)array + lVar12 * 4);
                lVar12 = lVar12 + 1;
              } while (local_d0->n != lVar12);
              *nnode_global = lVar11;
            }
            free(array);
            iVar14 = local_c0->max;
            if (0 < (long)iVar14) {
              pRVar9 = *l2c;
              lVar11 = 0;
              do {
                lVar12 = pRVar9[lVar11];
                if (lVar12 != -1) {
                  pRVar9[lVar11] = lVar12 + lVar13;
                }
                lVar11 = lVar11 + 1;
              } while (iVar14 != lVar11);
            }
            uVar8 = ref_node_ghost_glob(local_c0,*l2c,1);
            if (uVar8 == 0) {
              uVar8 = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c"
                     ,0x213,"ref_grid_compact_cell_nodes",(ulong)uVar8,"xfer");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                   0x205,"ref_grid_compact_cell_nodes",(ulong)uVar8,"gather size");
          }
        }
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x202,
             "ref_grid_compact_cell_nodes",(ulong)uVar8,"allsum");
    }
  }
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_grid_compact_cell_nodes(REF_GRID ref_grid,
                                               REF_CELL ref_cell,
                                               REF_GLOB *nnode_global,
                                               REF_LONG *ncell_global,
                                               REF_GLOB **l2c) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT cell, node, cell_node, part;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT nnode, ncell;
  REF_INT proc, *counts;
  REF_GLOB offset;

  ref_malloc_init(*l2c, ref_node_max(ref_node), REF_GLOB, REF_EMPTY);

  (*nnode_global) = 0;
  (*ncell_global) = 0;
  nnode = 0;
  ncell = 0;

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_cell_part(ref_cell, ref_node, cell, &part), "part");
    if (ref_mpi_rank(ref_mpi) == part) {
      ncell++;
    }
    each_ref_cell_cell_node(ref_cell, cell_node) {
      if (ref_node_owned(ref_node, nodes[cell_node]) &&
          (REF_EMPTY == (*l2c)[nodes[cell_node]])) {
        (*l2c)[nodes[cell_node]] = nnode;
        nnode++;
      }
    }
  }
  (*ncell_global) = ncell;
  RSS(ref_mpi_allsum(ref_mpi, ncell_global, 1, REF_LONG_TYPE), "allsum");

  ref_malloc(counts, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &nnode, counts, REF_INT_TYPE), "gather size");
  offset = 0;
  for (proc = 0; proc < ref_mpi_rank(ref_mpi); proc++) {
    offset += counts[proc];
  }
  each_ref_mpi_part(ref_mpi, proc) { (*nnode_global) += counts[proc]; }